

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall
LM_Error_Value::tagCells1
          (LM_Error_Value *this,int *tag,int *tlo,int *thi,int *tagval,int *clearval,int *lo,int *hi
          ,int *domain_lo,int *domain_hi,Real *dx,Real *xlo,Real *prob_lo,Real *time,int *level)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  
  if (this->max_level < 0) {
    bVar4 = false;
  }
  else {
    bVar4 = this->max_level <= *level;
  }
  dVar1 = this->min_time;
  dVar2 = this->max_time;
  if (0.0 <= dVar1) {
    dVar3 = *time;
    if ((dVar2 < 0.0) || (dVar2 < dVar1)) {
      bVar6 = dVar1 <= dVar3;
      goto LAB_0026756f;
    }
    if (dVar1 <= dVar3) {
      bVar6 = dVar3 <= dVar2;
      bVar8 = 0;
    }
    else {
      bVar6 = false;
      bVar8 = 0;
    }
  }
  else {
    bVar6 = false;
LAB_0026756f:
    bVar7 = 1;
    bVar8 = 1;
    if (0.0 <= dVar2) {
      bVar5 = *time <= dVar2;
      goto LAB_0026758f;
    }
  }
  bVar7 = bVar8;
  bVar5 = false;
LAB_0026758f:
  if (!(bool)(bVar4 | ~(bVar7 | bVar5 | bVar6) & 1)) {
    (*this->lmef_box)(tag,tlo,thi,tagval,clearval,(this->box).xlo,(this->box).xhi,lo,hi,domain_lo,
                      domain_hi,dx,xlo,prob_lo,time,level);
  }
  return;
}

Assistant:

void
LM_Error_Value::tagCells1(int* tag, const int* tlo, const int* thi,
                          const int* tagval, const int* clearval,
                          const int* lo, const int* hi,
                          const int* domain_lo, const int* domain_hi,
                          const Real* dx, const Real* xlo,
                          const Real* prob_lo, const Real* time,
                          const int* level) const
{
    AMREX_ASSERT(lmef_box);

    bool max_level_applies = ( (max_level < 0) || ( *level < max_level ) );
    bool valid_time_range = (min_time >= 0) && (max_time >= 0) && (min_time <= max_time);
    bool in_valid_time_range = valid_time_range && (*time >= min_time ) && (*time <= max_time);
    bool one_side_lo = !valid_time_range && (min_time >= 0) && (*time >= min_time);
    bool one_side_hi = !valid_time_range && (max_time >= 0) && (*time <= max_time);
    bool time_window_applies = in_valid_time_range || one_side_lo || one_side_hi || !valid_time_range;

    if (max_level_applies && time_window_applies)
    {
      lmef_box(tag, AMREX_ARLIM_ANYD(tlo), AMREX_ARLIM_ANYD(thi),
               tagval, clearval,
               AMREX_ZFILL(box.lo()), AMREX_ZFILL(box.hi()),
               lo, hi, domain_lo, domain_hi, dx, xlo, prob_lo, time, level);
    }
}